

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strpos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_value *pjVar2;
  uint uVar3;
  sxi32 sVar4;
  char *pBlob;
  char *pPattern;
  uint uVar5;
  uint uVar6;
  jx9_real jVar7;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  sxu32 local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  uVar5 = 8;
  jVar7 = 0.0;
  if (1 < nArg) {
    pBlob = jx9_value_to_string(*apArg,(int *)&local_3c);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_34);
    local_38 = 0;
    uVar6 = 0;
    if (nArg != 2) {
      pjVar2 = apArg[2];
      jx9MemObjToInteger(pjVar2);
      uVar1 = *(uint *)&pjVar2->x;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      if (local_3c - uVar3 != 0 && (int)uVar3 <= (int)local_3c) {
        pBlob = pBlob + uVar3;
        uVar6 = uVar3;
        local_3c = local_3c - uVar3;
      }
    }
    if (0 < (int)local_34 && 0 < (int)local_3c) {
      sVar4 = SyBlobSearch(pBlob,local_3c,pPattern,local_34,&local_38);
      if (sVar4 == 0) {
        jVar7 = (jx9_real)(ulong)(uVar6 + local_38);
        uVar5 = 2;
        goto LAB_00131c3c;
      }
    }
    jVar7 = 0.0;
  }
LAB_00131c3c:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = jVar7;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | uVar5;
  return 0;
}

Assistant:

static int jx9Builtin_strpos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen, nStart;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	nStart = 0;
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
		}
		if( nStart >= nLen ){
			/* Invalid offset */
			nStart = 0;
		}else{
			zBlob += nStart;
			nLen -= nStart;
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the pattern position */
		jx9_result_int64(pCtx, (jx9_int64)(nOfft+nStart));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}